

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

void __thiscall
ON_PeriodicDomain::Initialize(ON_PeriodicDomain *this,ON_Interval *dom,bool *closed,double normband)

{
  double dVar1;
  
  dVar1 = dom->m_t[1];
  this->m_dom[0].m_t[0] = dom->m_t[0];
  this->m_dom[0].m_t[1] = dVar1;
  dVar1 = dom[1].m_t[1];
  this->m_dom[1].m_t[0] = dom[1].m_t[0];
  this->m_dom[1].m_t[1] = dVar1;
  this->m_closed[0] = *closed;
  this->m_closed[1] = closed[1];
  this->m_normband = normband;
  this->m_deck[0] = 0;
  this->m_deck[1] = 0;
  return;
}

Assistant:

void ON_PeriodicDomain::Initialize(const ON_Interval dom[2], const bool closed[2], double normband)
{
	m_dom[0] = dom[0];
	m_dom[1] = dom[1];
	m_closed[0] = closed[0];
	m_closed[1] = closed[1];
	m_normband = normband;
	m_deck[0] = m_deck[1] = 0;
}